

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlDebugDumpString(FILE *output,xmlChar *str)

{
  byte bVar1;
  uint __c;
  char *__ptr;
  long lVar2;
  size_t sStack_30;
  
  if (output == (FILE *)0x0) {
    output = (FILE *)_stdout;
  }
  if (str == (xmlChar *)0x0) {
    __ptr = "(NULL)";
    sStack_30 = 6;
  }
  else {
    for (lVar2 = 0; lVar2 != 0x28; lVar2 = lVar2 + 1) {
      bVar1 = str[lVar2];
      if (bVar1 == 0x20) {
LAB_0015e92f:
        __c = 0x20;
LAB_0015e931:
        fputc(__c,(FILE *)output);
      }
      else {
        __c = (uint)bVar1;
        if (bVar1 == 0) {
          return;
        }
        if (((byte)(bVar1 - 9) < 2) || (__c == 0xd)) goto LAB_0015e92f;
        if (-1 < (char)bVar1) goto LAB_0015e931;
        fprintf((FILE *)output,"#%X");
      }
    }
    __ptr = "...";
    sStack_30 = 3;
  }
  fwrite(__ptr,sStack_30,1,(FILE *)output);
  return;
}

Assistant:

void
xmlDebugDumpString(FILE * output, const xmlChar * str)
{
    int i;

    if (output == NULL)
	output = stdout;
    if (str == NULL) {
        fprintf(output, "(NULL)");
        return;
    }
    for (i = 0; i < 40; i++)
        if (str[i] == 0)
            return;
        else if (IS_BLANK_CH(str[i]))
            fputc(' ', output);
        else if (str[i] >= 0x80)
            fprintf(output, "#%X", str[i]);
        else
            fputc(str[i], output);
    fprintf(output, "...");
}